

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_TreeCollider.cpp
# Opt level: O1

void __thiscall Opcode::AABBTreeCollider::_CollideBoxTri(AABBTreeCollider *this,AABBNoLeafNode *b)

{
  Container *this_00;
  udword *puVar1;
  Point *v0;
  Point *v1;
  udword uVar2;
  AABBNoLeafNode *b_00;
  MeshInterface *pMVar3;
  IndexedTriangle *pIVar4;
  udword q;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  Point *pPVar8;
  ulong uVar9;
  Point *pPVar10;
  ulong uVar11;
  Point *pPVar12;
  udword uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  Point vmax;
  Point local_10c;
  Point *local_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  float local_80 [6];
  float local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined1 local_58 [16];
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  v0 = this->mLeafVerts;
  v1 = this->mLeafVerts + 1;
  local_100 = this->mLeafVerts + 2;
  this_00 = &this->mPairs;
  do {
    this->mNbBVPrimTests = this->mNbBVPrimTests + 1;
    fVar21 = this->mLeafVerts[0].x;
    local_68 = this->mLeafVerts[1].x;
    fVar18 = (b->mAABB).mCenter.x;
    fVar15 = (b->mAABB).mExtents.x;
    fVar36 = fVar21 - fVar18;
    fVar16 = local_68 - fVar18;
    fVar25 = this->mLeafVerts[2].x;
    fVar18 = fVar25 - fVar18;
    fVar30 = fVar36;
    if (fVar16 <= fVar36) {
      fVar30 = fVar16;
    }
    if (fVar18 <= fVar30) {
      fVar30 = fVar18;
    }
    if (fVar15 < fVar30) {
      return;
    }
    fVar30 = fVar16;
    if (fVar16 <= fVar36) {
      fVar30 = fVar36;
    }
    fVar35 = fVar18;
    if (fVar18 <= fVar30) {
      fVar35 = fVar30;
    }
    if (fVar35 < -fVar15) {
      return;
    }
    fVar30 = (b->mAABB).mCenter.y;
    fVar35 = (b->mAABB).mExtents.y;
    fVar34 = this->mLeafVerts[0].y - fVar30;
    fVar26 = this->mLeafVerts[1].y - fVar30;
    fVar30 = this->mLeafVerts[2].y - fVar30;
    fVar37 = fVar34;
    if (fVar26 <= fVar34) {
      fVar37 = fVar26;
    }
    if (fVar30 <= fVar37) {
      fVar37 = fVar30;
    }
    if (fVar35 < fVar37) {
      return;
    }
    fVar37 = fVar26;
    if (fVar26 <= fVar34) {
      fVar37 = fVar34;
    }
    fVar20 = fVar30;
    if (fVar30 <= fVar37) {
      fVar20 = fVar37;
    }
    if (fVar20 < -fVar35) {
      return;
    }
    fVar37 = (b->mAABB).mCenter.z;
    fVar20 = (b->mAABB).mExtents.z;
    fVar31 = this->mLeafVerts[0].z - fVar37;
    fVar29 = this->mLeafVerts[1].z - fVar37;
    fVar37 = this->mLeafVerts[2].z - fVar37;
    fVar17 = fVar31;
    if (fVar29 <= fVar31) {
      fVar17 = fVar29;
    }
    if (fVar37 <= fVar17) {
      fVar17 = fVar37;
    }
    if (fVar20 < fVar17) {
      return;
    }
    fVar17 = fVar29;
    if (fVar29 <= fVar31) {
      fVar17 = fVar31;
    }
    fVar19 = fVar37;
    if (fVar37 <= fVar17) {
      fVar19 = fVar17;
    }
    if (fVar19 < -fVar20) {
      return;
    }
    local_a8 = ZEXT416((uint)fVar35);
    local_98 = ZEXT416((uint)fVar15);
    fVar22 = fVar16 - fVar36;
    fVar23 = fVar26 - fVar34;
    fVar32 = fVar29 - fVar31;
    local_f8._0_4_ = fVar16;
    fVar19 = fVar18 - fVar16;
    local_e8._0_4_ = fVar30;
    fVar17 = fVar30 - fVar26;
    fVar27 = fVar37 - fVar29;
    local_58._0_4_ = -fVar32;
    local_58._4_4_ = 0x80000000;
    local_58._8_4_ = 0x80000000;
    local_58._12_4_ = 0x80000000;
    local_80[0] = fVar23 * fVar27 - fVar17 * fVar32;
    local_48 = -fVar22;
    uStack_44 = 0x80000000;
    uStack_40 = 0x80000000;
    uStack_3c = 0x80000000;
    local_b8 = ZEXT416((uint)fVar27);
    local_80[1] = fVar32 * fVar19 - fVar27 * fVar22;
    local_c8 = ZEXT416((uint)fVar19);
    local_d8 = ZEXT416((uint)fVar17);
    local_80[2] = fVar22 * fVar17 - fVar19 * fVar23;
    lVar6 = 0;
    do {
      fVar28 = (&(b->mAABB).mExtents.x)[lVar6];
      if (local_80[lVar6] <= 0.0) {
        (&local_10c.x)[lVar6] = fVar28;
        fVar28 = -fVar28;
      }
      else {
        (&local_10c.x)[lVar6] = -fVar28;
      }
      local_80[lVar6 + 3] = fVar28;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    fVar28 = (-local_80[0] * fVar36 - fVar34 * local_80[1]) - local_80[2] * fVar31;
    if (0.0 < local_10c.z * local_80[2] + local_10c.x * local_80[0] + local_10c.y * local_80[1] +
              fVar28) {
      return;
    }
    if (fVar28 + local_80[2] * local_80[5] + local_80[0] * local_80[3] + local_80[1] * local_80[4] <
        0.0) {
      return;
    }
    if (this->mFullPrimBoxTest == true) {
      fVar28 = fVar32 * fVar34 + fVar31 * -fVar23;
      fVar33 = fVar32 * fVar30 + -fVar23 * fVar37;
      fVar24 = fVar33;
      if (fVar28 <= fVar33) {
        fVar24 = fVar28;
      }
      fVar14 = ABS(fVar32) * fVar35 + ABS(fVar23) * fVar20;
      if (fVar14 < fVar24) {
        return;
      }
      if (fVar28 <= fVar33) {
        fVar28 = fVar33;
      }
      if (fVar28 < -fVar14) {
        return;
      }
      fVar28 = fVar22 * fVar31 + fVar36 * (float)local_58._0_4_;
      fVar33 = fVar22 * fVar37 + (float)local_58._0_4_ * fVar18;
      fVar24 = fVar33;
      if (fVar28 <= fVar33) {
        fVar24 = fVar28;
      }
      fVar32 = ABS(fVar32) * fVar15 + ABS(fVar22) * fVar20;
      if (fVar32 < fVar24) {
        return;
      }
      if (fVar28 <= fVar33) {
        fVar28 = fVar33;
      }
      if (fVar28 < -fVar32) {
        return;
      }
      fVar32 = fVar23 * fVar16 + fVar26 * local_48;
      fVar24 = fVar23 * fVar18 + local_48 * fVar30;
      fVar28 = fVar24;
      if (fVar32 <= fVar24) {
        fVar28 = fVar32;
      }
      fVar22 = ABS(fVar23) * fVar15 + ABS(fVar22) * fVar35;
      if (fVar22 < fVar28) {
        return;
      }
      if (fVar32 <= fVar24) {
        fVar32 = fVar24;
      }
      if (fVar32 < -fVar22) {
        return;
      }
      fVar22 = fVar27 * fVar34 - fVar31 * fVar17;
      fVar32 = fVar27 * fVar30 - fVar37 * fVar17;
      fVar23 = fVar32;
      if (fVar22 <= fVar32) {
        fVar23 = fVar22;
      }
      fVar28 = ABS(fVar27) * fVar35 + ABS(fVar17) * fVar20;
      if (fVar28 < fVar23) {
        return;
      }
      if (fVar22 <= fVar32) {
        fVar22 = fVar32;
      }
      if (fVar22 < -fVar28) {
        return;
      }
      fVar22 = fVar19 * fVar31 - fVar36 * fVar27;
      fVar23 = fVar37 * fVar19 - fVar27 * fVar18;
      fVar37 = fVar23;
      if (fVar22 <= fVar23) {
        fVar37 = fVar22;
      }
      fVar27 = ABS(fVar27) * fVar15 + ABS(fVar19) * fVar20;
      if (fVar27 < fVar37) {
        return;
      }
      if (fVar22 <= fVar23) {
        fVar22 = fVar23;
      }
      if (fVar22 < -fVar27) {
        return;
      }
      fVar37 = fVar17 * fVar36 - fVar34 * fVar19;
      fVar23 = fVar17 * fVar16 - fVar19 * fVar26;
      fVar22 = fVar23;
      if (fVar37 <= fVar23) {
        fVar22 = fVar37;
      }
      fVar17 = ABS(fVar17) * fVar15 + ABS(fVar19) * fVar35;
      if (fVar17 < fVar22) {
        return;
      }
      if (fVar37 <= fVar23) {
        fVar37 = fVar23;
      }
      if (fVar37 < -fVar17) {
        return;
      }
      fVar17 = this->mLeafVerts[0].y - this->mLeafVerts[2].y;
      fVar19 = this->mLeafVerts[0].z - this->mLeafVerts[2].z;
      fVar34 = fVar34 * fVar19 - fVar31 * fVar17;
      fVar22 = fVar19 * fVar26 - fVar29 * fVar17;
      fVar37 = fVar22;
      if (fVar34 <= fVar22) {
        fVar37 = fVar34;
      }
      fVar23 = ABS(fVar19) * fVar35 + fVar20 * ABS(fVar17);
      if (fVar23 < fVar37) {
        return;
      }
      if (fVar34 <= fVar22) {
        fVar34 = fVar22;
      }
      if (fVar34 < -fVar23) {
        return;
      }
      fVar34 = fVar21 - fVar25;
      fVar37 = fVar31 * fVar34 - fVar36 * fVar19;
      fVar29 = fVar29 * fVar34 - fVar19 * fVar16;
      fVar36 = fVar29;
      if (fVar37 <= fVar29) {
        fVar36 = fVar37;
      }
      fVar20 = ABS(fVar19) * fVar15 + fVar20 * ABS(fVar34);
      if (fVar20 < fVar36) {
        return;
      }
      if (fVar37 <= fVar29) {
        fVar37 = fVar29;
      }
      if (fVar37 < -fVar20) {
        return;
      }
      fVar16 = fVar16 * fVar17 - fVar26 * fVar34;
      fVar30 = fVar18 * fVar17 - fVar30 * fVar34;
      fVar18 = fVar30;
      if (fVar16 <= fVar30) {
        fVar18 = fVar16;
      }
      fVar15 = ABS(fVar17) * fVar15 + ABS(fVar34) * fVar35;
      if (fVar15 < fVar18) {
        return;
      }
      if (fVar16 <= fVar30) {
        fVar16 = fVar30;
      }
      if (fVar16 < -fVar15) {
        return;
      }
    }
    b_00 = (AABBNoLeafNode *)b->mPosData;
    if (((ulong)b_00 & 1) == 0) {
      _CollideBoxTri(this,b_00);
    }
    else {
      pMVar3 = this->mIMesh0;
      uVar13 = (udword)((ulong)b_00 >> 1);
      uVar7 = (ulong)(pMVar3->mTriStride * uVar13);
      pIVar4 = pMVar3->mTris;
      pPVar8 = pMVar3->mVerts;
      uVar2 = pMVar3->mVertexStride;
      uVar9 = (ulong)(*(int *)((long)pIVar4->mVRef + uVar7) * uVar2);
      uVar11 = (ulong)(*(int *)((long)pIVar4->mVRef + uVar7 + 4) * uVar2);
      uVar7 = (ulong)(uVar2 * *(int *)((long)pIVar4->mVRef + uVar7 + 8));
      this->mNbPrimPrimTests = this->mNbPrimPrimTests + 1;
      fVar18 = this->mLeafVerts[1].y;
      fVar15 = this->mLeafVerts[0].y;
      fVar26 = fVar18 - fVar15;
      fVar30 = this->mLeafVerts[1].z;
      fVar16 = this->mLeafVerts[0].z;
      fVar37 = fVar30 - fVar16;
      fVar36 = this->mLeafVerts[2].y;
      fVar34 = fVar36 - fVar15;
      fVar35 = this->mLeafVerts[2].z;
      local_f8 = ZEXT416((uint)fVar35);
      local_10c.x = fVar26 * (fVar35 - fVar16) - fVar34 * fVar37;
      local_10c.y = fVar37 * (fVar25 - fVar21) - (fVar35 - fVar16) * (local_68 - fVar21);
      local_10c.z = fVar34 * (local_68 - fVar21) - (fVar25 - fVar21) * fVar26;
      local_b8._0_4_ = -local_10c.x;
      local_b8._4_4_ = 0x80000000;
      local_b8._8_4_ = 0x80000000;
      local_b8._12_4_ = 0x80000000;
      local_e8 = ZEXT416((uint)fVar16);
      fVar27 = ((float)local_b8._0_4_ * fVar21 - fVar15 * local_10c.y) - local_10c.z * fVar16;
      fVar37 = *(float *)((long)&pPVar8->x + uVar9);
      fVar26 = *(float *)((long)&pPVar8->y + uVar9);
      local_98 = ZEXT416((uint)fVar26);
      local_a8 = ZEXT416((uint)fVar37);
      fVar34 = *(float *)((long)&pPVar8->z + uVar9);
      fVar20 = *(float *)((long)&pPVar8->y + uVar11);
      fVar17 = *(float *)((long)&pPVar8->x + uVar11);
      fVar29 = *(float *)((long)&pPVar8->z + uVar11);
      fVar31 = *(float *)((long)&pPVar8->y + uVar7);
      fVar19 = *(float *)((long)&pPVar8->x + uVar7);
      fVar22 = *(float *)((long)&pPVar8->z + uVar7);
      fVar28 = local_10c.z * fVar34 + local_10c.x * fVar37 + local_10c.y * fVar26 + fVar27;
      fVar23 = local_10c.z * fVar29 + local_10c.x * fVar17 + local_10c.y * fVar20 + fVar27;
      fVar27 = local_10c.z * fVar22 + local_10c.x * fVar19 + local_10c.y * fVar31 + fVar27;
      fVar28 = (float)(~-(uint)(ABS(fVar28) < 1e-06) & (uint)fVar28);
      fVar23 = (float)(~-(uint)(ABS(fVar23) < 1e-06) & (uint)fVar23);
      fVar27 = (float)(~-(uint)(ABS(fVar27) < 1e-06) & (uint)fVar27);
      fVar32 = fVar28 * fVar23;
      local_d8 = ZEXT416((uint)fVar28);
      fVar24 = fVar28 * fVar27;
      if ((fVar32 <= 0.0) || (uVar5 = 0, fVar24 <= 0.0)) {
        local_c8 = ZEXT416((uint)fVar32);
        fVar20 = fVar20 - fVar26;
        fVar29 = fVar29 - fVar34;
        fVar31 = fVar31 - fVar26;
        fVar22 = fVar22 - fVar34;
        fVar33 = fVar20 * fVar22 - fVar31 * fVar29;
        fVar17 = fVar17 - fVar37;
        fVar19 = fVar19 - fVar37;
        fVar29 = fVar29 * fVar19 - fVar22 * fVar17;
        fVar20 = fVar31 * fVar17 - fVar19 * fVar20;
        fVar37 = (-fVar33 * fVar37 - fVar26 * fVar29) - fVar34 * fVar20;
        fVar21 = fVar16 * fVar20 + fVar21 * fVar33 + fVar15 * fVar29 + fVar37;
        fVar18 = fVar30 * fVar20 + local_68 * fVar33 + fVar18 * fVar29 + fVar37;
        fVar37 = fVar35 * fVar20 + fVar25 * fVar33 + fVar36 * fVar29 + fVar37;
        fVar21 = (float)(~-(uint)(ABS(fVar21) < 1e-06) & (uint)fVar21);
        fVar18 = (float)(~-(uint)(ABS(fVar18) < 1e-06) & (uint)fVar18);
        fVar37 = (float)(~-(uint)(ABS(fVar37) < 1e-06) & (uint)fVar37);
        if ((fVar21 * fVar18 <= 0.0) || (uVar5 = 0, fVar21 * fVar37 <= 0.0)) {
          local_e8 = ZEXT416((uint)fVar24);
          local_f8 = ZEXT416((uint)fVar23);
          pPVar10 = (Point *)((long)&pPVar8->x + uVar9);
          pPVar12 = (Point *)((long)&pPVar8->x + uVar11);
          pPVar8 = (Point *)((long)&pPVar8->x + uVar7);
          fVar25 = ABS(local_10c.y * fVar20 + -local_10c.z * fVar29);
          fVar30 = ABS(local_10c.z * fVar33 + (float)local_b8._0_4_ * fVar20);
          fVar15 = fVar30;
          if (fVar30 <= fVar25) {
            fVar15 = fVar25;
          }
          uVar5 = (uint)(fVar25 < fVar30);
          if (fVar15 < ABS(local_10c.x * fVar29 + -local_10c.y * fVar33)) {
            uVar5 = 2;
          }
          uVar7 = (ulong)(uVar5 << 2);
          fVar15 = *(float *)((long)&v0->x + uVar7);
          fVar25 = *(float *)((long)&v1->x + uVar7);
          fVar30 = *(float *)((long)&local_100->x + uVar7);
          fVar16 = *(float *)((long)&pPVar10->x + uVar7);
          fVar36 = *(float *)((long)&pPVar12->x + uVar7);
          fVar35 = *(float *)((long)&pPVar8->x + uVar7);
          if (fVar21 * fVar18 <= 0.0) {
            if (0.0 < fVar21 * fVar37) {
LAB_001ba8a6:
              fVar34 = (fVar15 - fVar25) * fVar18;
              fVar26 = (fVar30 - fVar25) * fVar18;
              fVar20 = fVar18 - fVar21;
              fVar37 = fVar18 - fVar37;
              fVar15 = fVar25;
              goto LAB_001ba8f8;
            }
            if (((fVar21 != 0.0) || (NAN(fVar21))) || (0.0 < fVar18 * fVar37)) {
              fVar34 = (fVar25 - fVar15) * fVar21;
              fVar26 = (fVar30 - fVar15) * fVar21;
              fVar20 = fVar21 - fVar18;
              fVar37 = fVar21 - fVar37;
              goto LAB_001ba8f8;
            }
            if ((fVar18 != 0.0) || (NAN(fVar18))) goto LAB_001ba8a6;
            if ((fVar37 != 0.0) || (NAN(fVar37))) goto LAB_001ba84a;
LAB_001bab04:
            uVar5 = CoplanarTriTri(&local_10c,v0,v1,local_100,pPVar10,pPVar12,pPVar8);
          }
          else {
LAB_001ba84a:
            fVar34 = (fVar15 - fVar30) * fVar37;
            fVar26 = (fVar25 - fVar30) * fVar37;
            fVar20 = fVar37 - fVar21;
            fVar37 = fVar37 - fVar18;
            fVar15 = fVar30;
LAB_001ba8f8:
            if (fVar32 <= 0.0) {
              if (0.0 < fVar24) {
LAB_001ba997:
                fVar21 = (fVar16 - fVar36) * fVar23;
                fVar18 = (fVar35 - fVar36) * fVar23;
                fVar25 = fVar23 - fVar27;
                goto LAB_001ba9b7;
              }
              if (((fVar28 == 0.0) && (!NAN(fVar28))) && (fVar23 * fVar27 <= 0.0)) {
                if ((fVar23 == 0.0) && (!NAN(fVar23))) {
                  if ((fVar27 == 0.0) && (!NAN(fVar27))) goto LAB_001bab04;
                  goto LAB_001ba915;
                }
                goto LAB_001ba997;
              }
              fVar21 = (fVar36 - fVar16) * fVar28;
              fVar18 = (fVar35 - fVar16) * fVar28;
              fVar23 = fVar28 - fVar23;
              fVar25 = fVar28 - fVar27;
            }
            else {
LAB_001ba915:
              fVar21 = (fVar16 - fVar35) * fVar27;
              fVar18 = (fVar36 - fVar35) * fVar27;
              fVar25 = fVar27 - fVar23;
              fVar36 = fVar35;
              fVar23 = fVar27;
LAB_001ba9b7:
              fVar23 = fVar23 - fVar28;
              fVar16 = fVar36;
            }
            fVar35 = fVar20 * fVar37;
            fVar36 = fVar23 * fVar25;
            fVar15 = fVar15 * fVar35 * fVar36;
            fVar30 = fVar34 * fVar37 * fVar36 + fVar15;
            fVar15 = fVar36 * fVar26 * fVar20 + fVar15;
            fVar16 = fVar35 * fVar36 * fVar16;
            fVar25 = fVar21 * fVar35 * fVar25 + fVar16;
            fVar16 = fVar35 * fVar18 * fVar23 + fVar16;
            fVar21 = fVar15;
            if (fVar30 <= fVar15) {
              fVar21 = fVar30;
              fVar30 = fVar15;
            }
            fVar18 = fVar25;
            if (fVar25 <= fVar16) {
              fVar18 = fVar16;
            }
            if (fVar25 <= fVar16) {
              fVar16 = fVar25;
            }
            uVar5 = -(uint)(fVar16 <= fVar30 && fVar21 <= fVar18) & 1;
          }
        }
      }
      if (uVar5 != 0) {
        if ((this->mPairs).mCurNbEntries == (this->mPairs).mMaxNbEntries) {
          IceCore::Container::Resize(this_00,1);
        }
        uVar5 = (this->mPairs).mCurNbEntries;
        (this->mPairs).mCurNbEntries = uVar5 + 1;
        (this->mPairs).mEntries[uVar5] = uVar13;
        uVar2 = this->mLeafIndex;
        if ((this->mPairs).mCurNbEntries == (this->mPairs).mMaxNbEntries) {
          IceCore::Container::Resize(this_00,1);
        }
        uVar5 = (this->mPairs).mCurNbEntries;
        (this->mPairs).mCurNbEntries = uVar5 + 1;
        (this->mPairs).mEntries[uVar5] = uVar2;
        puVar1 = &(this->super_Collider).mFlags;
        *(byte *)puVar1 = (byte)*puVar1 | 4;
      }
    }
    if ((~(this->super_Collider).mFlags & 5) == 0) {
      return;
    }
    b = (AABBNoLeafNode *)b->mNegData;
  } while (((ulong)b & 1) == 0);
  pMVar3 = this->mIMesh0;
  uVar13 = (udword)((ulong)b >> 1);
  uVar7 = (ulong)(pMVar3->mTriStride * uVar13);
  pIVar4 = pMVar3->mTris;
  pPVar8 = pMVar3->mVerts;
  uVar2 = pMVar3->mVertexStride;
  uVar9 = (ulong)(*(int *)((long)pIVar4->mVRef + uVar7) * uVar2);
  uVar11 = (ulong)(*(int *)((long)pIVar4->mVRef + uVar7 + 4) * uVar2);
  uVar7 = (ulong)(uVar2 * *(int *)((long)pIVar4->mVRef + uVar7 + 8));
  this->mNbPrimPrimTests = this->mNbPrimPrimTests + 1;
  fVar21 = this->mLeafVerts[1].x;
  fVar18 = this->mLeafVerts[0].x;
  fVar26 = fVar21 - fVar18;
  fVar15 = this->mLeafVerts[1].y;
  fVar25 = this->mLeafVerts[0].y;
  fVar20 = fVar15 - fVar25;
  fVar30 = this->mLeafVerts[1].z;
  fVar16 = this->mLeafVerts[0].z;
  fVar17 = fVar30 - fVar16;
  fVar36 = this->mLeafVerts[2].x;
  fVar34 = fVar36 - fVar18;
  fVar35 = this->mLeafVerts[2].y;
  fVar29 = fVar35 - fVar25;
  fVar37 = this->mLeafVerts[2].z;
  local_f8 = ZEXT416((uint)fVar37);
  local_10c.x = fVar20 * (fVar37 - fVar16) - fVar29 * fVar17;
  local_10c.y = fVar17 * fVar34 - (fVar37 - fVar16) * fVar26;
  local_10c.z = fVar29 * fVar26 - fVar34 * fVar20;
  local_68 = -local_10c.x;
  local_98._0_4_ = fVar25;
  uStack_64 = 0x80000000;
  uStack_60 = 0x80000000;
  uStack_5c = 0x80000000;
  local_e8 = ZEXT416((uint)fVar16);
  fVar27 = (local_68 * fVar18 - fVar25 * local_10c.y) - local_10c.z * fVar16;
  fVar26 = *(float *)((long)&pPVar8->y + uVar9);
  local_a8._0_4_ = fVar26;
  fVar34 = *(float *)((long)&pPVar8->x + uVar9);
  local_b8._0_4_ = fVar34;
  fVar20 = *(float *)((long)&pPVar8->z + uVar9);
  fVar17 = *(float *)((long)&pPVar8->y + uVar11);
  fVar29 = *(float *)((long)&pPVar8->x + uVar11);
  fVar31 = *(float *)((long)&pPVar8->z + uVar11);
  fVar19 = *(float *)((long)&pPVar8->y + uVar7);
  fVar22 = *(float *)((long)&pPVar8->x + uVar7);
  fVar23 = *(float *)((long)&pPVar8->z + uVar7);
  fVar24 = local_10c.z * fVar20 + local_10c.x * fVar34 + local_10c.y * fVar26 + fVar27;
  fVar32 = local_10c.z * fVar31 + local_10c.x * fVar29 + local_10c.y * fVar17 + fVar27;
  fVar27 = local_10c.z * fVar23 + local_10c.x * fVar22 + local_10c.y * fVar19 + fVar27;
  fVar24 = (float)(~-(uint)(ABS(fVar24) < 1e-06) & (uint)fVar24);
  fVar32 = (float)(~-(uint)(ABS(fVar32) < 1e-06) & (uint)fVar32);
  fVar27 = (float)(~-(uint)(ABS(fVar27) < 1e-06) & (uint)fVar27);
  fVar28 = fVar24 * fVar32;
  local_d8 = ZEXT416((uint)fVar24);
  if ((0.0 < fVar28) && (uVar5 = 0, 0.0 < fVar24 * fVar27)) goto LAB_001bb1d1;
  local_58 = ZEXT416((uint)fVar28);
  local_c8 = ZEXT416((uint)fVar27);
  fVar17 = fVar17 - fVar26;
  fVar31 = fVar31 - fVar20;
  fVar19 = fVar19 - fVar26;
  fVar23 = fVar23 - fVar20;
  fVar33 = fVar17 * fVar23 - fVar19 * fVar31;
  fVar29 = fVar29 - fVar34;
  fVar22 = fVar22 - fVar34;
  fVar31 = fVar31 * fVar22 - fVar23 * fVar29;
  fVar17 = fVar19 * fVar29 - fVar22 * fVar17;
  fVar26 = (-fVar33 * fVar34 - fVar26 * fVar31) - fVar20 * fVar17;
  fVar18 = fVar16 * fVar17 + fVar18 * fVar33 + fVar25 * fVar31 + fVar26;
  fVar21 = fVar30 * fVar17 + fVar21 * fVar33 + fVar15 * fVar31 + fVar26;
  fVar26 = fVar37 * fVar17 + fVar36 * fVar33 + fVar35 * fVar31 + fVar26;
  fVar18 = (float)(~-(uint)(ABS(fVar18) < 1e-06) & (uint)fVar18);
  fVar21 = (float)(~-(uint)(ABS(fVar21) < 1e-06) & (uint)fVar21);
  fVar26 = (float)(~-(uint)(ABS(fVar26) < 1e-06) & (uint)fVar26);
  if ((0.0 < fVar18 * fVar21) && (uVar5 = 0, 0.0 < fVar18 * fVar26)) goto LAB_001bb1d1;
  pPVar10 = (Point *)((long)&pPVar8->x + uVar9);
  pPVar12 = (Point *)((long)&pPVar8->x + uVar11);
  pPVar8 = (Point *)((long)&pPVar8->x + uVar7);
  fVar25 = ABS(local_10c.y * fVar17 + -local_10c.z * fVar31);
  fVar30 = ABS(local_10c.z * fVar33 + local_68 * fVar17);
  fVar15 = fVar30;
  if (fVar30 <= fVar25) {
    fVar15 = fVar25;
  }
  uVar5 = 2;
  if (ABS(local_10c.x * fVar31 + -local_10c.y * fVar33) <= fVar15) {
    uVar5 = (uint)(fVar25 < fVar30);
  }
  uVar7 = (ulong)(uVar5 << 2);
  fVar15 = *(float *)((long)&v0->x + uVar7);
  fVar25 = *(float *)((long)&v1->x + uVar7);
  fVar30 = *(float *)((long)&local_100->x + uVar7);
  fVar16 = *(float *)((long)&pPVar10->x + uVar7);
  fVar36 = *(float *)((long)&pPVar12->x + uVar7);
  fVar35 = *(float *)((long)&pPVar8->x + uVar7);
  if (fVar18 * fVar21 <= 0.0) {
    if (0.0 < fVar18 * fVar26) {
LAB_001bb037:
      fVar34 = (fVar15 - fVar25) * fVar21;
      fVar37 = (fVar30 - fVar25) * fVar21;
      fVar20 = fVar21 - fVar18;
      fVar26 = fVar21 - fVar26;
      fVar15 = fVar25;
      goto LAB_001bb093;
    }
    if (((fVar18 != 0.0) || (NAN(fVar18))) || (0.0 < fVar21 * fVar26)) {
      fVar34 = (fVar25 - fVar15) * fVar18;
      fVar37 = (fVar30 - fVar15) * fVar18;
      fVar20 = fVar18 - fVar21;
      fVar26 = fVar18 - fVar26;
      goto LAB_001bb093;
    }
    if ((fVar21 != 0.0) || (NAN(fVar21))) goto LAB_001bb037;
    if ((fVar26 != 0.0) || (NAN(fVar26))) {
      fVar34 = (fVar15 - fVar30) * fVar26;
      fVar37 = (fVar25 - fVar30) * fVar26;
      fVar20 = fVar26 - fVar18;
      fVar26 = fVar26 - fVar21;
      fVar15 = fVar30;
      goto LAB_001bb093;
    }
LAB_001bb28f:
    uVar5 = CoplanarTriTri(&local_10c,v0,v1,local_100,pPVar10,pPVar12,pPVar8);
    goto LAB_001bb1d1;
  }
  fVar34 = (fVar15 - fVar30) * fVar26;
  fVar37 = (fVar25 - fVar30) * fVar26;
  fVar20 = fVar26 - fVar18;
  fVar26 = fVar26 - fVar21;
  fVar15 = fVar30;
LAB_001bb093:
  if (fVar28 <= 0.0) {
    if (fVar24 * fVar27 <= 0.0) {
      if (((fVar24 != 0.0) || (NAN(fVar24))) || (0.0 < fVar32 * fVar27)) {
        fVar25 = (fVar36 - fVar16) * fVar24;
        fVar18 = (fVar35 - fVar16) * fVar24;
        fVar21 = fVar24 - fVar32;
        fVar27 = fVar24 - fVar27;
        goto LAB_001bb14c;
      }
      if ((fVar32 == 0.0) && (!NAN(fVar32))) {
        if ((fVar27 == 0.0) && (!NAN(fVar27))) goto LAB_001bb28f;
        goto LAB_001bb0ab;
      }
    }
    fVar25 = (fVar16 - fVar36) * fVar32;
    fVar18 = (fVar35 - fVar36) * fVar32;
    fVar21 = fVar32 - fVar24;
    fVar27 = fVar32 - fVar27;
    fVar16 = fVar36;
  }
  else {
LAB_001bb0ab:
    fVar25 = (fVar16 - fVar35) * fVar27;
    fVar18 = (fVar36 - fVar35) * fVar27;
    fVar21 = fVar27 - fVar24;
    fVar27 = fVar27 - fVar32;
    fVar16 = fVar35;
  }
LAB_001bb14c:
  fVar35 = fVar20 * fVar26;
  fVar36 = fVar21 * fVar27;
  fVar15 = fVar15 * fVar35 * fVar36;
  fVar30 = fVar34 * fVar26 * fVar36 + fVar15;
  fVar15 = fVar36 * fVar37 * fVar20 + fVar15;
  fVar16 = fVar35 * fVar36 * fVar16;
  fVar25 = fVar25 * fVar35 * fVar27 + fVar16;
  fVar16 = fVar35 * fVar18 * fVar21 + fVar16;
  fVar21 = fVar15;
  if (fVar30 <= fVar15) {
    fVar21 = fVar30;
    fVar30 = fVar15;
  }
  fVar18 = fVar25;
  if (fVar25 <= fVar16) {
    fVar18 = fVar16;
  }
  if (fVar25 <= fVar16) {
    fVar16 = fVar25;
  }
  uVar5 = -(uint)(fVar16 <= fVar30 && fVar21 <= fVar18) & 1;
LAB_001bb1d1:
  if (uVar5 != 0) {
    if ((this->mPairs).mCurNbEntries == (this->mPairs).mMaxNbEntries) {
      IceCore::Container::Resize(this_00,1);
    }
    uVar5 = (this->mPairs).mCurNbEntries;
    (this->mPairs).mCurNbEntries = uVar5 + 1;
    (this->mPairs).mEntries[uVar5] = uVar13;
    uVar2 = this->mLeafIndex;
    if ((this->mPairs).mCurNbEntries == (this->mPairs).mMaxNbEntries) {
      IceCore::Container::Resize(this_00,1);
    }
    uVar5 = (this->mPairs).mCurNbEntries;
    (this->mPairs).mCurNbEntries = uVar5 + 1;
    (this->mPairs).mEntries[uVar5] = uVar2;
    puVar1 = &(this->super_Collider).mFlags;
    *(byte *)puVar1 = (byte)*puVar1 | 4;
  }
  return;
}

Assistant:

void AABBTreeCollider::_CollideBoxTri(const AABBNoLeafNode* b)
{
	// Perform triangle-box overlap test
	if(!TriBoxOverlap(b->mAABB.mCenter, b->mAABB.mExtents))	return;

	// Keep same triangle, deal with first child
	if(b->HasPosLeaf())	PrimTestIndexTri(b->GetPosPrimitive());
	else				_CollideBoxTri(b->GetPos());

	if(ContactFound()) return;

	// Keep same triangle, deal with second child
	if(b->HasNegLeaf())	PrimTestIndexTri(b->GetNegPrimitive());
	else				_CollideBoxTri(b->GetNeg());
}